

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::rec_coface
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          vector<short,_std::allocator<short>_> *vertices,Siblings *curr_sib,int curr_nbVertices,
          vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
          *cofaces,bool star,int nbVertices)

{
  short sVar1;
  bool bVar2;
  pointer ppVar3;
  reference pvVar4;
  size_type sVar5;
  Siblings *pSVar6;
  byte local_96;
  bool local_95;
  bool local_81;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
  local_78;
  value_type local_6a;
  Vertex_handle tmp;
  byte local_5a;
  bool local_59;
  bool addCoface_1;
  bool equalDim;
  bool local_49;
  undefined1 local_48 [7];
  bool addCoface;
  undefined1 local_40 [8];
  Simplex_handle simplex;
  bool star_local;
  vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
  *cofaces_local;
  int curr_nbVertices_local;
  Siblings *curr_sib_local;
  vector<short,_std::allocator<short>_> *vertices_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this_local;
  
  if ((star) || (curr_nbVertices <= nbVertices)) {
    simplex.m_ptr._7_1_ = star;
    Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
    ::members(curr_sib);
    boost::container::
    flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
    ::begin((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
             *)local_40);
    while( true ) {
      Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
      ::members(curr_sib);
      boost::container::
      flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
      ::end((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
             *)local_48);
      bVar2 = boost::container::operator!=
                        ((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                          *)local_40,
                         (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                          *)local_48);
      if (!bVar2) break;
      bVar2 = std::vector<short,_std::allocator<short>_>::empty(vertices);
      if (bVar2) {
        bVar2 = (simplex.m_ptr._7_1_ & 1) != 0;
        local_81 = bVar2 || curr_nbVertices == nbVertices;
        local_49 = local_81;
        if (bVar2 || curr_nbVertices == nbVertices) {
          std::
          vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
          ::push_back(cofaces,(value_type *)local_40);
        }
        if (((local_49 & 1U) == 0) || ((simplex.m_ptr._7_1_ & 1) != 0)) {
          boost::container::
          vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
          ::vec_iterator((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                          *)&stack0xffffffffffffffa8,
                         (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                          *)local_40);
          bVar2 = has_children<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>
                            (this,(vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                   *)&stack0xffffffffffffffa8);
          if (bVar2) {
            ppVar3 = boost::container::
                     vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                     ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                   *)local_40);
            pSVar6 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
                     ::children(&ppVar3->second);
            rec_coface(this,vertices,pSVar6,curr_nbVertices + 1,cofaces,
                       (bool)(simplex.m_ptr._7_1_ & 1),nbVertices);
          }
        }
      }
      else {
        ppVar3 = boost::container::
                 vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                 ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                               *)local_40);
        sVar1 = ppVar3->first;
        pvVar4 = std::vector<short,_std::allocator<short>_>::back(vertices);
        if (sVar1 == *pvVar4) {
          local_95 = (simplex.m_ptr._7_1_ & 1) != 0 || curr_nbVertices == nbVertices;
          local_59 = local_95;
          sVar5 = std::vector<short,_std::allocator<short>_>::size(vertices);
          local_96 = 0;
          if (sVar5 == 1) {
            local_96 = local_59;
          }
          local_5a = local_96 & 1;
          if (local_5a != 0) {
            std::
            vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
            ::push_back(cofaces,(value_type *)local_40);
          }
          if (((local_5a & 1) == 0) || ((simplex.m_ptr._7_1_ & 1) != 0)) {
            boost::container::
            vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
            ::vec_iterator((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                            *)&stack0xffffffffffffff98,
                           (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                            *)local_40);
            bVar2 = has_children<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>
                              (this,(vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                     *)&stack0xffffffffffffff98);
            if (bVar2) {
              pvVar4 = std::vector<short,_std::allocator<short>_>::back(vertices);
              local_6a = *pvVar4;
              std::vector<short,_std::allocator<short>_>::pop_back(vertices);
              ppVar3 = boost::container::
                       vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                       ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                     *)local_40);
              pSVar6 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
                       ::children(&ppVar3->second);
              rec_coface(this,vertices,pSVar6,curr_nbVertices + 1,cofaces,
                         (bool)(simplex.m_ptr._7_1_ & 1),nbVertices);
              std::vector<short,_std::allocator<short>_>::push_back(vertices,&local_6a);
            }
          }
        }
        else {
          ppVar3 = boost::container::
                   vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                   ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                 *)local_40);
          sVar1 = ppVar3->first;
          pvVar4 = std::vector<short,_std::allocator<short>_>::back(vertices);
          if (*pvVar4 < sVar1) {
            return;
          }
          boost::container::
          vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
          ::vec_iterator(&local_78,
                         (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                          *)local_40);
          bVar2 = has_children<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>
                            (this,&local_78);
          if (bVar2) {
            ppVar3 = boost::container::
                     vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                     ::operator->((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                   *)local_40);
            pSVar6 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
                     ::children(&ppVar3->second);
            rec_coface(this,vertices,pSVar6,curr_nbVertices + 1,cofaces,
                       (bool)(simplex.m_ptr._7_1_ & 1),nbVertices);
          }
        }
      }
      boost::container::
      vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
      ::operator++((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                    *)local_40);
    }
  }
  return;
}

Assistant:

void rec_coface(std::vector<Vertex_handle> &vertices, Siblings const*curr_sib, int curr_nbVertices,
                  std::vector<Simplex_handle>& cofaces, bool star, int nbVertices) const {
    if (!(star || curr_nbVertices <= nbVertices))  // dimension of actual simplex <= nbVertices
      return;
    for (Simplex_handle simplex = curr_sib->members().begin(); simplex != curr_sib->members().end(); ++simplex) {
      if (vertices.empty()) {
        // If we reached the end of the vertices, and the simplex has more vertices than the given simplex
        // => we found a coface

        // Add a coface if we want the star or if the number of vertices of the current simplex matches with nbVertices
        bool addCoface = (star || curr_nbVertices == nbVertices);
        if (addCoface)
          cofaces.push_back(simplex);
        if ((!addCoface || star) && has_children(simplex))  // Rec call
          rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
      } else {
        if (simplex->first == vertices.back()) {
          // If curr_sib matches with the top vertex
          bool equalDim = (star || curr_nbVertices == nbVertices);  // dimension of actual simplex == nbVertices
          bool addCoface = vertices.size() == 1 && equalDim;
          if (addCoface)
            cofaces.push_back(simplex);
          if ((!addCoface || star) && has_children(simplex)) {
            // Rec call
            Vertex_handle tmp = vertices.back();
            vertices.pop_back();
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
            vertices.push_back(tmp);
          }
        } else if (simplex->first > vertices.back()) {
          return;
        } else {
          // (simplex->first < vertices.back()
          if (has_children(simplex))
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
        }
      }
    }
  }